

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O1

SUNErrCode SUNHashMap_Values(SUNHashMap map,void ***values,int64_t value_size)

{
  void **ppvVar1;
  long lVar2;
  int iVar3;
  SUNStlVector_SUNHashMapKeyValue pSVar4;
  long lVar5;
  
  if (map != (SUNHashMap)0x0) {
    ppvVar1 = (void **)malloc(value_size * map->buckets->capacity);
    *values = ppvVar1;
    pSVar4 = map->buckets;
    if (0 < pSVar4->capacity) {
      lVar2 = 0;
      iVar3 = 0;
      do {
        if (pSVar4->values[lVar2] != (SUNHashMapKeyValue)0x0) {
          lVar5 = (long)iVar3;
          iVar3 = iVar3 + 1;
          (*values)[lVar5] = pSVar4->values[lVar2]->value;
        }
        lVar2 = lVar2 + 1;
        pSVar4 = map->buckets;
      } while (lVar2 < pSVar4->capacity);
    }
    return 0;
  }
  return -9999;
}

Assistant:

SUNDIALS_MAYBE_UNUSED
SUNErrCode SUNHashMap_Values(SUNHashMap map, void*** values, int64_t value_size)
{
  int count = 0;

  if (!map) { return SUN_ERR_ARG_CORRUPT; }

  *values = (void**)malloc(SUNHashMap_Capacity(map) * value_size);
  if (!values) { return SUN_ERR_MALLOC_FAIL; }

  /* Copy the values into a new array */
  for (int64_t i = 0; i < SUNHashMap_Capacity(map); i++)
  {
    SUNHashMapKeyValue kvp = *SUNStlVector_SUNHashMapKeyValue_At(map->buckets, i);
    if (kvp) { (*values)[count++] = kvp->value; }
  }

  return SUN_SUCCESS;
}